

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::grow
          (SmallArray<InstructionVMEvalContext::StackFrame_*,_32U> *this,uint newSize)

{
  uint local_24;
  StackFrame **ppSStack_20;
  uint i;
  StackFrame **newData;
  uint newSize_local;
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    ppSStack_20 = NULLC::construct<InstructionVMEvalContext::StackFrame*>(newData._4_4_);
  }
  else {
    ppSStack_20 = Allocator::construct<InstructionVMEvalContext::StackFrame*>
                            (this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    ppSStack_20[local_24] = this->data[local_24];
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<InstructionVMEvalContext::StackFrame*>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<InstructionVMEvalContext::StackFrame*>
                (this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = ppSStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}